

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

string * __thiscall cm::String::str_abi_cxx11_(String *this)

{
  string *s;
  String *this_local;
  
  this_local = (String *)str_if_stable_abi_cxx11_(this);
  if ((string *)this_local == (string *)0x0) {
    internally_mutate_to_stable_string(this);
    this_local = (String *)
                 std::
                 __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
  }
  return (string *)this_local;
}

Assistant:

std::string const& String::str()
{
  if (std::string const* s = this->str_if_stable()) {
    return *s;
  }
  // Mutate to hold a std::string that is stable for the lifetime
  // of our current value.
  this->internally_mutate_to_stable_string();
  return *this->string_;
}